

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffghad(fitsfile *fptr,long *headstart,long *datastart,long *dataend,int *status)

{
  long local_50;
  LONGLONG edata;
  LONGLONG sdata;
  LONGLONG shead;
  int *status_local;
  long *dataend_local;
  long *datastart_local;
  long *headstart_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    shead = (LONGLONG)status;
    status_local = (int *)dataend;
    dataend_local = datastart;
    datastart_local = headstart;
    headstart_local = (long *)fptr;
    ffghadll(fptr,&sdata,&edata,&local_50,status);
    if (datastart_local != (long *)0x0) {
      if (sdata <= 0x7fffffffffffffff) {
        *datastart_local = sdata;
      }
      else {
        *(undefined4 *)shead = 0x19c;
      }
    }
    if (dataend_local != (long *)0x0) {
      if (edata <= 0x7fffffffffffffff) {
        *dataend_local = edata;
      }
      else {
        *(undefined4 *)shead = 0x19c;
      }
    }
    if (status_local != (int *)0x0) {
      if (local_50 <= 0x7fffffffffffffff) {
        *(long *)status_local = local_50;
      }
      else {
        *(undefined4 *)shead = 0x19c;
      }
    }
    fptr_local._4_4_ = *(int *)shead;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffghad(fitsfile *fptr,     /* I - FITS file pointer                     */
            long *headstart,  /* O - byte offset to beginning of CHDU      */
            long *datastart,  /* O - byte offset to beginning of next HDU  */
            long *dataend,    /* O - byte offset to beginning of next HDU  */
            int *status)       /* IO - error status     */
/*
  Return the address (= byte offset) in the FITS file to the beginning of
  the current HDU, the beginning of the data unit, and the end of the data unit.
*/
{
    LONGLONG shead, sdata, edata;

    if (*status > 0)
        return(*status);

    ffghadll(fptr, &shead, &sdata, &edata, status);

    if (headstart)
    {
        if (shead > LONG_MAX)
            *status = NUM_OVERFLOW;
        else
            *headstart = (long) shead;
    }

    if (datastart)
    {
        if (sdata > LONG_MAX)
            *status = NUM_OVERFLOW;
        else
            *datastart = (long) sdata;
    }

    if (dataend)
    {
        if (edata > LONG_MAX)
            *status = NUM_OVERFLOW;
        else
            *dataend = (long) edata;       
    }

    return(*status);
}